

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O0

void mctools_pathseps_platform(mcu8str *path)

{
  char cVar1;
  int iVar2;
  mcu8str *in_RDI;
  char drive_letter;
  
  mcu8str_replace(in_RDI,'\\','/');
  cVar1 = mctools_drive_letter(in_RDI);
  if (cVar1 != '\0') {
    iVar2 = mctools_impl_has_winnamespace(in_RDI);
    if (iVar2 == 0) {
      *in_RDI->c_str = cVar1;
    }
    else {
      in_RDI->c_str[4] = cVar1;
    }
  }
  return;
}

Assistant:

void mctools_pathseps_platform( mcu8str* path )
  {
#ifdef MC_IS_WINDOWS
    mcu8str_replace( path, '/', '\\' );
#else
    mcu8str_replace( path, '\\', '/' );
#endif
    //Upper case drive letter for consistency:
    char drive_letter = mctools_drive_letter( path );
    if ( drive_letter ) {
      if ( mctools_impl_has_winnamespace( path ) )
        path->c_str[4] = drive_letter;
      else
        path->c_str[0] = drive_letter;
    }
  }